

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  string *str;
  char *pcVar8;
  cmListFileContext *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  uint __len;
  ulong __val;
  string_view str_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string __str;
  string line;
  string local_90;
  string local_70;
  string local_50;
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((this->FileLine < 0) || (iVar6 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar6 != 0)) {
    pcVar2 = this->Makefile;
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar7 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,var,var + sVar7);
    str = (string *)cmMakefile::GetDefinition(pcVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (str == (string *)0x0) {
      pcVar2 = this->Makefile;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      sVar7 = strlen(var);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,var,var + sVar7);
      cmMakefile::MaybeWarnUninitialized(pcVar2,&local_90,this->FileName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (this->RemoveEmpty == false) {
        return (char *)0x0;
      }
      str = &cmValue::Empty_abi_cxx11_;
    }
    else if (this->EscapeQuotes == true) {
      str_00._M_str = (str->_M_dataplus)._M_p;
      str_00._M_len = str->_M_string_length;
      cmEscapeQuotes_abi_cxx11_(&local_90,str_00);
      pcVar8 = AddString(this,&local_90);
      uVar11 = local_90.field_2._M_allocated_capacity;
      _Var12._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar1) {
        return pcVar8;
      }
      goto LAB_00426a0c;
    }
    pcVar8 = AddString(this,str);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    cmMakefile::GetBacktrace(this->Makefile);
    pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_90);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    }
    if ((pcVar9->DeferId).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      local_90.field_2._8_8_ =
           (pcVar9->DeferId).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p;
      local_90.field_2._M_allocated_capacity =
           (pcVar9->DeferId).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      local_90._M_dataplus._M_p = (pointer)0x9;
      local_90._M_string_length = 0x757bcc;
      views._M_len = 2;
      views._M_array = (iterator)&local_90;
      cmCatViews_abi_cxx11_(&local_50,views);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      uVar3 = this->FileLine;
      __val = -uVar3;
      if (0 < (long)uVar3) {
        __val = uVar3;
      }
      __len = 1;
      if (9 < __val) {
        uVar10 = __val;
        uVar5 = 4;
        do {
          __len = uVar5;
          if (uVar10 < 100) {
            __len = __len - 2;
            goto LAB_0042698e;
          }
          if (uVar10 < 1000) {
            __len = __len - 1;
            goto LAB_0042698e;
          }
          if (uVar10 < 10000) goto LAB_0042698e;
          bVar4 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar5 = __len + 4;
        } while (bVar4);
        __len = __len + 1;
      }
LAB_0042698e:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)((long)uVar3 >> 0x3f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90._M_dataplus._M_p + -((long)uVar3 >> 0x3f),__len,__val);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar8 = AddString(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return pcVar8;
    }
    uVar11 = CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0])
    ;
    _Var12._M_p = local_70._M_dataplus._M_p;
LAB_00426a0c:
    operator_delete(_Var12._M_p,uVar11 + 1);
  }
  return pcVar8;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::string line;
    cmListFileContext const& top = this->Makefile->GetBacktrace().Top();
    if (top.DeferId) {
      line = cmStrCat("DEFERRED:"_s, *top.DeferId);
    } else {
      line = std::to_string(this->FileLine);
    }
    return this->AddString(line);
  }
  cmValue value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmEscapeQuotes(*value));
  }
  return this->AddString(value);
}